

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteConObjExpressions
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  char **ppcVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  ExprArgWriter ew;
  ExprArgWriter local_40;
  
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons < 1) {
    uVar3 = 0;
  }
  else {
    uVar6 = 0;
    do {
      ppcVar1 = (this->feeder_->nlme_).row_names_;
      pcVar7 = "";
      if (ppcVar1 != (char **)0x0) {
        pcVar2 = ppcVar1[uVar6];
        pcVar7 = "";
        if (pcVar2 != (char *)0x0) {
          pcVar7 = pcVar2;
        }
      }
      uVar3 = uVar6 + 1;
      BinaryFormatter::apr(&this->super_FormatterType,&this->nm,"%c%d\t#%s\n",0x43,uVar6,pcVar7);
      BinaryFormatter::nput(&this->super_FormatterType,&this->nm,0.0);
      uVar6 = uVar3;
    } while ((long)uVar3 <
             (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  }
  iVar5 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
  if ((int)uVar3 <
      (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons + iVar5) {
    uVar3 = uVar3 & 0xffffffff;
    do {
      ppcVar1 = (this->feeder_->nlme_).row_names_;
      pcVar7 = "";
      if (ppcVar1 != (char **)0x0) {
        pcVar2 = ppcVar1[uVar3];
        pcVar7 = "";
        if (pcVar2 != (char *)0x0) {
          pcVar7 = pcVar2;
        }
      }
      uVar6 = uVar3 + 1;
      BinaryFormatter::apr
                (&this->super_FormatterType,&this->nm,"%c%d\t#%s\n",0x4c,(uint)-iVar5 + uVar3,pcVar7
                );
      BinaryFormatter::nput(&this->super_FormatterType,&this->nm,0.0);
      iVar5 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      uVar3 = uVar6;
    } while ((int)uVar6 <
             (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons + iVar5);
  }
  if (0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs) {
    uVar4 = 0;
    do {
      BinaryFormatter::apr
                (&this->super_FormatterType,&this->nm,"%c%d %d\t#%s\n",0x4f,(ulong)uVar4,
                 (ulong)(uint)(this->feeder_->nlme_).obj_sense_,(this->feeder_->nlme_).obj_name_);
      local_40.nargs_ = 1;
      local_40.nlw_ = this;
      NLFeeder_Easy::
      FeedObjExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
                (this->feeder_,uVar4,&local_40);
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConObjExpressions() {
  int i=0;
  for (; i<Hdr().num_algebraic_cons; ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'C', i,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (;
       i<Hdr().num_algebraic_cons + Hdr().num_logical_cons;
       ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'L',
        i - Hdr().num_algebraic_cons,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (i=0; i<Hdr().num_objs; ++i) {
    WriteDefinedVariables(-i-1);              // -i-1
    apr(nm, "%c%d %d\t#%s\n", 'O', i,
        (int)Feeder().ObjType(i),
        Feeder().ObjDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedObjExpression(i, ew);
  }
}